

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O2

int tree::truncate(char *__file,__off_t __length)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  wchar_t *pwVar5;
  uint uVar6;
  wstring str;
  int local_b8;
  byte_string local_b0;
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  converter;
  
  uVar1 = *(undefined8 *)(__length + 0x18);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert(&converter);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::from_bytes(&str,&converter,*(char **)(__length + 0x10));
  iVar4 = 0;
  iVar3 = 0;
  uVar6 = 0;
  while( true ) {
    if ((int)__file + -2 <= iVar3 + iVar4) break;
    if (iVar4 < iVar3) {
      pwVar5 = (wchar_t *)std::__cxx11::wstring::at((ulong)&str);
      iVar2 = wcwidth(*pwVar5);
      iVar4 = iVar2 + iVar4;
      uVar6 = uVar6 + 1;
    }
    else {
      pwVar5 = (wchar_t *)std::__cxx11::wstring::at((ulong)&str);
      iVar2 = wcwidth(*pwVar5);
      iVar3 = iVar2 + iVar3;
    }
  }
  std::__cxx11::wstring::erase((ulong)&str,(ulong)uVar6);
  std::__cxx11::wstring::insert((ulong)&str,(wchar_t *)(ulong)uVar6);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::to_bytes(&local_b0,&converter,&str);
  std::__cxx11::string::operator=((string *)(__length + 0x10),(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  local_b8 = (int)uVar1;
  *(int *)(__length + 0xc) = *(int *)(__length + 0xc) + (*(int *)(__length + 0x18) - local_b8);
  *(int *)(__length + 4) = *(int *)__length + iVar3 + iVar4 + 1;
  std::__cxx11::wstring::~wstring((wstring *)&str);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert(&converter);
  return extraout_EAX;
}

Assistant:

void truncate(const int l, Cell &cell)
{
    int old_bytesize = cell.text.size();
    std::wstring_convert<std::codecvt_utf8<wchar_t>, wchar_t> converter;
    std::wstring str = converter.from_bytes(cell.text.c_str());
    int ls = 0, rs = 0;
    int i = 0, j = str.size() - 1;
    while (ls + rs < l - 2) {
        if (ls < rs) {
            ls += wchar_width(str.at(i));
            i++;
        } else {
            rs += wchar_width(str.at(j));
            j--;
        }
    }
    str.erase(i, j - i + 1);
    str.insert(i, L"…");
    // https://stackoverflow.com/questions/4804298/how-to-convert-wstring-into-string
    // use converter (.to_bytes: wstr->str, .from_bytes: str->wstr)
    cell.text = converter.to_bytes(str);
    cell.byte_end -= old_bytesize - cell.text.size();
    cell.col_end -= cell.col_end - cell.col_start - (ls + rs + 1);
}